

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Scene * __thiscall CMU462::DynamicScene::Scene::get_transformed_static_scene(Scene *this,double t)

{
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  undefined4 extraout_var;
  reference ppSVar4;
  undefined4 extraout_var_00;
  Scene *this_00;
  value_type local_a8;
  SceneLight *local_a0;
  SceneLight *light;
  iterator __end2_1;
  iterator __begin2_1;
  set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  *__range2_1;
  value_type local_70;
  SceneObject *staticObject;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2;
  vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  staticLights;
  vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  staticObjects;
  double t_local;
  Scene *this_local;
  
  std::
  vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>::
  vector((vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
          *)&staticLights.
             super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  ::vector((vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
            *)&__range2);
  __end2 = std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::begin(&this->objects);
  obj = (SceneObject *)
        std::
        set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
        ::end(&this->objects);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&obj);
    if (!bVar1) break;
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(&__end2);
    staticObject = (SceneObject *)*ppSVar3;
    iVar2 = (*((SceneObject *)staticObject)->_vptr_SceneObject[8])(t);
    local_70 = (value_type)CONCAT44(extraout_var,iVar2);
    if (local_70 != (value_type)0x0) {
      std::
      vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
      ::push_back((vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
                   *)&staticLights.
                      super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_70);
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end2);
  }
  __end2_1 = std::
             set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
             ::begin(&this->lights);
  light = (SceneLight *)
          std::
          set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
          ::end(&this->lights);
  while( true ) {
    bVar1 = std::operator!=(&__end2_1,(_Self *)&light);
    if (!bVar1) break;
    ppSVar4 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneLight_*>::operator*(&__end2_1)
    ;
    local_a0 = *ppSVar4;
    iVar2 = (**local_a0->_vptr_SceneLight)();
    local_a8 = (value_type)CONCAT44(extraout_var_00,iVar2);
    std::
    vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>::
    push_back((vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
               *)&__range2,&local_a8);
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneLight_*>::operator++(&__end2_1);
  }
  this_00 = (Scene *)operator_new(0x30);
  StaticScene::Scene::Scene
            (this_00,(vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
                      *)&staticLights.
                         super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
              *)&__range2);
  std::vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  ::~vector((vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
             *)&__range2);
  std::
  vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>::
  ~vector((vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
           *)&staticLights.
              super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_00;
}

Assistant:

StaticScene::Scene *Scene::get_transformed_static_scene(double t) {
  std::vector<StaticScene::SceneObject *> staticObjects;
  std::vector<StaticScene::SceneLight *> staticLights;

  for (SceneObject *obj : objects) {
    auto staticObject = obj->get_transformed_static_object(t);
    if (staticObject != nullptr)
      staticObjects.push_back(staticObject);
  }
  for (SceneLight *light : lights) {
    staticLights.push_back(light->get_static_light());
  }
  return new StaticScene::Scene(staticObjects, staticLights);
}